

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dds_bucket_id_mapping.c
# Opt level: O0

double dds_get_min_addressable_value(dds_bucket_id_mapping *bid_mapping)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_18;
  double min_addressable_value;
  dds_bucket_id_mapping *bid_mapping_local;
  
  if (bid_mapping->type == LOG_UPPER) {
    local_18 = exp(bid_mapping->log_gamma * -2147483648.0);
    if (local_18 <= 2.2250738585072014e-308) {
      local_18 = 2.2250738585072014e-308;
    }
  }
  else if (bid_mapping->type == LOG_LOWER) {
    dVar3 = exp(bid_mapping->log_gamma * -2147483647.0);
    dVar1 = bid_mapping->gamma_value * 2.2250738585072014e-308;
    dVar2 = dVar1;
    if (dVar1 <= dVar3) {
      dVar2 = dVar3;
    }
    local_18 = (double)(~-(ulong)NAN(dVar3) & (ulong)dVar2 | -(ulong)NAN(dVar3) & (ulong)dVar1);
  }
  else {
    local_18 = exp(bid_mapping->log_gamma * -2147483648.0);
    if (local_18 <= 2.2250738585072014e-308) {
      local_18 = 2.2250738585072014e-308;
    }
  }
  return local_18;
}

Assistant:

double dds_get_min_addressable_value(struct dds_bucket_id_mapping *bid_mapping){
    double min_addressable_value;
    switch (bid_mapping->type) {
        case LOG_UPPER:
            min_addressable_value = fmax(exp((INT_MIN) * bid_mapping->log_gamma), DBL_MIN);
            break;
        case LOG_LOWER:
            min_addressable_value = fmax(exp((INT_MIN + 1) * bid_mapping->log_gamma),
                                         DBL_MIN * bid_mapping->gamma_value);
            break;
        default:
            min_addressable_value = fmax(exp((INT_MIN) * bid_mapping->log_gamma), DBL_MIN);
    }
    return min_addressable_value;
}